

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_mult_zero_one(void)

{
  int iVar1;
  secp256k1_ge inf;
  secp256k1_ge point;
  secp256k1_ge res2;
  secp256k1_gej res1;
  secp256k1_scalar negone;
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_00000c70;
  secp256k1_ge *in_stack_00000c78;
  secp256k1_gej *in_stack_00000c80;
  secp256k1_gej *in_stack_fffffffffffffde8;
  secp256k1_gej *in_stack_fffffffffffffdf0;
  secp256k1_scalar *in_stack_fffffffffffffdf8;
  secp256k1_scalar *in_stack_fffffffffffffe00;
  secp256k1_ge *in_stack_fffffffffffffe10;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_ge *in_stack_fffffffffffffe20;
  secp256k1_gej *in_stack_fffffffffffffe48;
  secp256k1_ge *in_stack_fffffffffffffe50;
  
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffe10);
  secp256k1_scalar_negate(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  testutil_random_ge_test(in_stack_fffffffffffffe20);
  secp256k1_ge_set_infinity((secp256k1_ge *)0x147d3c);
  secp256k1_ecmult_const(in_stack_00000c80,in_stack_00000c78,in_stack_00000c70);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x147d62);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1179,"test condition failed: secp256k1_gej_is_infinity(&res1)");
    abort();
  }
  secp256k1_ecmult_const(in_stack_00000c80,in_stack_00000c78,in_stack_00000c70);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x147dd2);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x117d,"test condition failed: secp256k1_gej_is_infinity(&res1)");
    abort();
  }
  secp256k1_ecmult_const(in_stack_00000c80,in_stack_00000c78,in_stack_00000c70);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1182,"test condition failed: secp256k1_ge_eq_var(&res2, &point)");
    abort();
  }
  secp256k1_ecmult_const(in_stack_00000c80,in_stack_00000c78,in_stack_00000c70);
  secp256k1_gej_neg(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1188,"test condition failed: secp256k1_ge_eq_var(&res2, &point)");
    abort();
  }
  return;
}

Assistant:

static void ecmult_const_mult_zero_one(void) {
    secp256k1_scalar s;
    secp256k1_scalar negone;
    secp256k1_gej res1;
    secp256k1_ge res2;
    secp256k1_ge point;
    secp256k1_ge inf;

    testutil_random_scalar_order_test(&s);
    secp256k1_scalar_negate(&negone, &secp256k1_scalar_one);
    testutil_random_ge_test(&point);
    secp256k1_ge_set_infinity(&inf);

    /* 0*point */
    secp256k1_ecmult_const(&res1, &point, &secp256k1_scalar_zero);
    CHECK(secp256k1_gej_is_infinity(&res1));

    /* s*inf */
    secp256k1_ecmult_const(&res1, &inf, &s);
    CHECK(secp256k1_gej_is_infinity(&res1));

    /* 1*point */
    secp256k1_ecmult_const(&res1, &point, &secp256k1_scalar_one);
    secp256k1_ge_set_gej(&res2, &res1);
    CHECK(secp256k1_ge_eq_var(&res2, &point));

    /* -1*point */
    secp256k1_ecmult_const(&res1, &point, &negone);
    secp256k1_gej_neg(&res1, &res1);
    secp256k1_ge_set_gej(&res2, &res1);
    CHECK(secp256k1_ge_eq_var(&res2, &point));
}